

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::util_chgRowBoundsAll(HModel *this,double *XrowLower,double *XrowUpper)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = this->numRow;
  if (0 < (long)iVar1) {
    pdVar2 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      dVar7 = XrowLower[lVar5];
      if (1e+200 <= dVar7) {
        return (uint)lVar5 + 1;
      }
      dVar6 = XrowUpper[lVar5];
      if (dVar6 <= -1e+200) {
        return ~(uint)lVar5;
      }
      if (-1e+200 < dVar7) {
        dVar7 = dVar7 / pdVar2[lVar5];
      }
      pdVar3[lVar5] = dVar7;
      if (dVar6 < 1e+200) {
        dVar6 = dVar6 / pdVar2[lVar5];
      }
      pdVar4[lVar5] = dVar6;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  mlFg_Update(this,this->mlFg_action_NewBounds);
  return 0;
}

Assistant:

int HModel::util_chgRowBoundsAll(const double* XrowLower, const double* XrowUpper) {
  assert(XrowLower != NULL);
  assert(XrowUpper != NULL);
  for (int row = 0; row < numRow; ++row) {
    double lower = XrowLower[row];
    double upper = XrowUpper[row];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}